

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::doConnect(SocketInitiator *this,SessionID *s,Dictionary *d)

{
  socket_handle s_00;
  undefined8 uVar1;
  Dictionary *sessionID;
  bool bVar2;
  int iVar3;
  Session *pSVar4;
  SocketConnection *this_00;
  SocketMonitor *pMonitor;
  mapped_type *ppSVar5;
  int value;
  int value_00;
  int value_01;
  exception *anon_var_0;
  undefined1 local_278 [4];
  socket_handle result;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  HostDetails host;
  Log *log;
  Session *local_28;
  Session *session;
  Dictionary *d_local;
  SessionID *s_local;
  SocketInitiator *this_local;
  
  session = (Session *)d;
  d_local = (Dictionary *)s;
  s_local = (SessionID *)this;
  pSVar4 = Session::lookupSession(s);
  local_28 = pSVar4;
  UtcTimeStamp::now();
  bVar2 = Session::isSessionTime(pSVar4,(UtcTimeStamp *)&log);
  UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&log);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    host._72_8_ = Session::getLog(local_28);
    HostDetailsProvider::getHost
              ((HostDetails *)local_a8,&this->m_hostDetailsProvider,(SessionID *)d_local,
               (Dictionary *)session);
    pSVar4 = session;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"ReconnectInterval",&local_c9);
    bVar2 = Dictionary::has((Dictionary *)pSVar4,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pSVar4 = session;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"ReconnectInterval",&local_f1);
      iVar3 = Dictionary::getInt((Dictionary *)pSVar4,&local_f0);
      this->m_reconnectInterval = iVar3;
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    uVar1 = host._72_8_;
    std::operator+(&local_218,"Connecting to ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_1f8,&local_218," on port ");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_238,(IntTConvertor<int> *)(ulong)(ushort)host.address.field_2._8_2_,value);
    std::operator+(&local_1d8,&local_1f8,&local_238);
    std::operator+(&local_1b8,&local_1d8," (Source ");
    std::operator+(&local_198,&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&host.port);
    std::operator+(&local_178,&local_198,":");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_258,(IntTConvertor<int> *)(ulong)(ushort)host.sourceAddress.field_2._8_2_,
               value_00);
    std::operator+(&local_158,&local_178,&local_258);
    std::operator+(&local_138,&local_158,") ReconnectInterval=");
    IntTConvertor<int>::convert_abi_cxx11_
              ((string *)local_278,(IntTConvertor<int> *)(ulong)(uint)this->m_reconnectInterval,
               value_01);
    std::operator+(&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
    (**(code **)(*(long *)uVar1 + 0x30))(uVar1,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    anon_var_0._4_4_ =
         SocketConnector::connect
                   (&this->m_connector,(int)local_a8,
                    (sockaddr *)(ulong)(uint)(int)(short)host.address.field_2._8_2_,
                    this->m_noDelay & 1);
    Initiator::setPending(&this->super_Initiator,(SessionID *)d_local);
    this_00 = (SocketConnection *)operator_new(0x2100);
    sessionID = d_local;
    s_00 = anon_var_0._4_4_;
    pMonitor = SocketConnector::getMonitor(&this->m_connector);
    SocketConnection::SocketConnection(this_00,this,(SessionID *)sessionID,s_00,pMonitor);
    ppSVar5 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_pendingConnections,(key_type *)((long)&anon_var_0 + 4));
    *ppSVar5 = this_00;
    HostDetails::~HostDetails((HostDetails *)local_a8);
  }
  return;
}

Assistant:

void SocketInitiator::doConnect(const SessionID &s, const Dictionary &d) {
  try {

    Session *session = Session::lookupSession(s);
    if (!session->isSessionTime(UtcTimeStamp::now())) {
      return;
    }

    Log *log = session->getLog();

    HostDetails host = m_hostDetailsProvider.getHost(s, d);
    if (d.has(RECONNECT_INTERVAL)) // ReconnectInterval in [SESSION]
    {
      m_reconnectInterval = d.getInt(RECONNECT_INTERVAL);
    }

    log->onEvent(
        "Connecting to " + host.address + " on port " + IntConvertor::convert((unsigned short)host.port) + " (Source "
        + host.sourceAddress + ":" + IntConvertor::convert((unsigned short)host.sourcePort)
        + ") ReconnectInterval=" + IntConvertor::convert((int)m_reconnectInterval));
    socket_handle result = m_connector.connect(
        host.address,
        host.port,
        m_noDelay,
        m_sendBufSize,
        m_rcvBufSize,
        host.sourceAddress,
        host.sourcePort);
    setPending(s);

    m_pendingConnections[result] = new SocketConnection(*this, s, result, &m_connector.getMonitor());
  } catch (std::exception &) {}
}